

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_multi_prefix_op
          (Impl *this,SPIRVModule *module,Op opcode,Id type_id)

{
  Builder *pBVar1;
  pointer ppIVar2;
  pointer pvVar3;
  Id IVar4;
  Id IVar5;
  pointer pMVar6;
  Function *pFVar7;
  Block *pBVar8;
  Block *pBVar9;
  char *name;
  _Head_base<0UL,_spv::Instruction_*,_false> local_150;
  _Head_base<0UL,_spv::Instruction_*,_false> local_148;
  Id type_id_local;
  Id local_138;
  Id local_134;
  Block *entry;
  Id local_124;
  uint local_120;
  Id bool_type;
  Id uvec4_type;
  Op opcode_local;
  Block *local_110;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_108;
  Builder *local_f0;
  Block *local_e8;
  Block *local_e0;
  Id bvec4_type;
  Block *local_d0;
  Block *local_c8;
  Block *local_c0;
  Block *local_b8;
  Function *local_b0;
  Block *local_a8;
  Vector<MultiPrefixOp> *local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  _Head_base<0UL,_spv::Instruction_*,_false> local_80;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  undefined4 local_6c;
  Vector<spv::Id> types;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_a0 = &this->wave_multi_prefix_call_ids;
  pMVar6 = (this->wave_multi_prefix_call_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pMVar6 == (this->wave_multi_prefix_call_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar1 = &this->builder;
      local_a8 = (this->builder).buildPoint;
      entry = (Block *)0x0;
      type_id_local = type_id;
      opcode_local = opcode;
      IVar4 = spv::Builder::makeUintType(pBVar1,0x20);
      IVar4 = spv::Builder::makeVectorType(pBVar1,IVar4,4);
      uvec4_type = IVar4;
      bool_type = spv::Builder::makeBoolType(pBVar1);
      bvec4_type = spv::Builder::makeVectorType(pBVar1,bool_type,4);
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar4,type_id);
      types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&types,
                 &local_108);
      if (this->helper_lanes_participate_in_wave_ops == false) {
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                  (&types,&bool_type);
      }
      if (opcode - OpGroupNonUniformIAdd < 0xd) {
        name = &DAT_001a854c + *(int *)(&DAT_001a854c + (ulong)(opcode - OpGroupNonUniformIAdd) * 4)
        ;
      }
      else {
        name = "";
      }
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pFVar7 = spv::Builder::makeFunctionEntry
                         (pBVar1,DecorationMax,type_id,name,&types,&local_108,&entry);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector(&local_108);
      ppIVar2 = (pFVar7->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_134 = (*ppIVar2)->resultId;
      local_138 = ppIVar2[1]->resultId;
      local_124 = spv::Builder::createUndefined(pBVar1,type_id);
      local_e0 = (Block *)allocate_in_thread(0x78);
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      spv::Block::Block(local_e0,IVar4,pFVar7);
      local_110 = (Block *)allocate_in_thread(0x78);
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      spv::Block::Block(local_110,IVar4,pFVar7);
      local_c0 = (Block *)allocate_in_thread(0x78);
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      spv::Block::Block(local_c0,IVar4,pFVar7);
      local_e8 = (Block *)allocate_in_thread(0x78);
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      spv::Block::Block(local_e8,IVar4,pFVar7);
      local_b8 = (Block *)allocate_in_thread(0x78);
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      spv::Block::Block(local_b8,IVar4,pFVar7);
      (this->builder).buildPoint = entry;
      local_b0 = pFVar7;
      if (this->helper_lanes_participate_in_wave_ops == false) {
        pBVar8 = (Block *)allocate_in_thread(0x78);
        IVar4 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar4;
        spv::Block::Block(pBVar8,IVar4,pFVar7);
        pBVar9 = (Block *)allocate_in_thread(0x78);
        IVar4 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar4;
        spv::Block::Block(pBVar9,IVar4,pFVar7);
        spv::Builder::createSelectionMerge(pBVar1,pBVar8,0);
        local_c8 = pBVar8;
        spv::Builder::createConditionalBranch
                  (pBVar1,(pFVar7->parameterInstructions).
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]->resultId,pBVar8,pBVar9);
        local_d0 = entry;
        (this->builder).buildPoint = pBVar9;
        entry = pBVar9;
      }
      else {
        local_c8 = (Block *)0x0;
        local_d0 = (Block *)0x0;
      }
      local_150._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_150._M_head_impl;
      local_148._M_head_impl._0_4_ = 0x153;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_108,(uint *)&local_150,&uvec4_type);
      pvVar3 = local_108.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      IVar4 = spv::Builder::makeUintConstant(pBVar1,3,false);
      spv::Instruction::addIdOperand((Instruction *)pvVar3,IVar4);
      pvVar3 = local_108.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = pBVar1;
      IVar4 = spv::Builder::makeBoolConstant(pBVar1,true,false);
      spv::Instruction::addIdOperand((Instruction *)pvVar3,IVar4);
      local_148._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_148._M_head_impl;
      local_120 = 199;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_150,(uint *)&local_148,&uvec4_type);
      spv::Instruction::addIdOperand
                (local_150._M_head_impl,
                 *(Id *)((long)local_108.
                               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8));
      spv::Instruction::addIdOperand(local_150._M_head_impl,local_138);
      IVar4 = (local_150._M_head_impl)->resultId;
      local_78._M_head_impl =
           (Instruction *)
           local_108.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      add_instruction(this,entry,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_78);
      if (local_78._M_head_impl != (Instruction *)0x0) {
        (*(local_78._M_head_impl)->_vptr_Instruction[1])();
      }
      local_78._M_head_impl = (Instruction *)0x0;
      local_80._M_head_impl = local_150._M_head_impl;
      local_150._M_head_impl = (Instruction *)0x0;
      add_instruction(this,entry,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_80);
      if (local_80._M_head_impl != (Instruction *)0x0) {
        (*(local_80._M_head_impl)->_vptr_Instruction[1])();
      }
      local_80._M_head_impl = (Instruction *)0x0;
      spv::Builder::createBranch(local_f0,local_e0);
      if (local_150._M_head_impl != (Instruction *)0x0) {
        (*(local_150._M_head_impl)->_vptr_Instruction[1])();
      }
      if ((Instruction *)
          local_108.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)
            &(local_108.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
      }
      pBVar1 = local_f0;
      pBVar8 = local_110;
      (this->builder).buildPoint = local_e0;
      spv::Builder::createLoopMerge(local_f0,local_c0,local_110,0);
      spv::Builder::createBranch(pBVar1,pBVar8);
      (this->builder).buildPoint = pBVar8;
      IVar5 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar5;
      local_150._M_head_impl._0_4_ = IVar5;
      local_148._M_head_impl._0_4_ = 0x152;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_108,(uint *)&local_150,&uvec4_type);
      pvVar3 = local_108.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      IVar5 = spv::Builder::makeUintConstant(pBVar1,3,false);
      spv::Instruction::addIdOperand((Instruction *)pvVar3,IVar5);
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,IVar4);
      local_148._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_148._M_head_impl;
      local_120 = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_150,(uint *)&local_148,&bvec4_type);
      spv::Instruction::addIdOperand(local_150._M_head_impl,IVar4);
      spv::Instruction::addIdOperand
                (local_150._M_head_impl,
                 *(Id *)((long)local_108.
                               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8));
      local_120 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = local_120;
      local_6c = 0x9b;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_148,&local_120,&bool_type);
      spv::Instruction::addIdOperand(local_148._M_head_impl,(local_150._M_head_impl)->resultId);
      IVar4 = (local_148._M_head_impl)->resultId;
      local_88._M_head_impl =
           (Instruction *)
           local_108.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      add_instruction(this,pBVar8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_88);
      if (local_88._M_head_impl != (Instruction *)0x0) {
        (*(local_88._M_head_impl)->_vptr_Instruction[1])();
      }
      local_88._M_head_impl = (Instruction *)0x0;
      local_90._M_head_impl = local_150._M_head_impl;
      local_150._M_head_impl = (Instruction *)0x0;
      add_instruction(this,local_110,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_90);
      pBVar8 = local_b8;
      if (local_90._M_head_impl != (Instruction *)0x0) {
        (*(local_90._M_head_impl)->_vptr_Instruction[1])();
      }
      local_90._M_head_impl = (Instruction *)0x0;
      local_98._M_head_impl = local_148._M_head_impl;
      local_148._M_head_impl = (Instruction *)0x0;
      add_instruction(this,local_110,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_98);
      pBVar1 = local_f0;
      if (local_98._M_head_impl != (Instruction *)0x0) {
        (*(local_98._M_head_impl)->_vptr_Instruction[1])();
      }
      local_98._M_head_impl = (Instruction *)0x0;
      spv::Builder::createSelectionMerge(pBVar1,pBVar8,0);
      spv::Builder::createConditionalBranch(pBVar1,IVar4,local_e8,pBVar8);
      if (local_148._M_head_impl != (Instruction *)0x0) {
        (*(local_148._M_head_impl)->_vptr_Instruction[1])();
      }
      if (local_150._M_head_impl != (Instruction *)0x0) {
        (*(local_150._M_head_impl)->_vptr_Instruction[1])();
      }
      local_138 = IVar4;
      if ((Instruction *)
          local_108.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)
            &(local_108.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
      }
      pBVar9 = local_e8;
      (this->builder).buildPoint = local_e8;
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      local_150._M_head_impl._0_4_ = IVar4;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op&>
                ((uint *)&local_108,(uint *)&local_150,&type_id_local);
      pvVar3 = local_108.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      IVar4 = spv::Builder::makeUintConstant(pBVar1,3,false);
      spv::Instruction::addIdOperand((Instruction *)pvVar3,IVar4);
      spv::Instruction::addImmediateOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,2);
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_134);
      local_134 = *(Id *)((long)local_108.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 8);
      local_38._M_head_impl =
           (Instruction *)
           local_108.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      add_instruction(this,pBVar9,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
      if (local_38._M_head_impl != (Instruction *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Instruction[1])();
      }
      spv::Builder::createBranch(pBVar1,pBVar8);
      if ((Instruction *)
          local_108.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)
            &(local_108.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
      }
      (this->builder).buildPoint = pBVar8;
      IVar4 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar4;
      local_150._M_head_impl._0_4_ = IVar4;
      local_148._M_head_impl._0_4_ = 0xf5;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_108,(uint *)&local_150,&type_id_local);
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_134);
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 *(Id *)((long)(((local_e8->instructions).
                                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t + 8));
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_124);
      spv::Instruction::addIdOperand
                ((Instruction *)
                 local_108.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 *(Id *)((long)(((local_110->instructions).
                                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t + 8));
      IVar4 = *(Id *)((long)local_108.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8);
      local_40._M_head_impl =
           (Instruction *)
           local_108.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      add_instruction(this,pBVar8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_40);
      if (local_40._M_head_impl != (Instruction *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Instruction[1])();
      }
      pBVar9 = local_c0;
      spv::Builder::createConditionalBranch(pBVar1,local_138,local_c0,local_e0);
      pBVar8 = local_c8;
      if ((Instruction *)
          local_108.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)
            &(local_108.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
      }
      (this->builder).buildPoint = pBVar9;
      if (pBVar8 != (Block *)0x0) {
        spv::Builder::createBranch(pBVar1,pBVar8);
        (this->builder).buildPoint = pBVar8;
        IVar5 = (this->builder).uniqueId + 1;
        (this->builder).uniqueId = IVar5;
        local_150._M_head_impl._0_4_ = IVar5;
        local_148._M_head_impl._0_4_ = 0xf5;
        std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                  ((uint *)&local_108,(uint *)&local_150,&type_id_local);
        spv::Instruction::addIdOperand
                  ((Instruction *)
                   local_108.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,IVar4);
        spv::Instruction::addIdOperand
                  ((Instruction *)
                   local_108.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   *(Id *)((long)(((pBVar9->instructions).
                                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t + 8));
        spv::Instruction::addIdOperand
                  ((Instruction *)
                   local_108.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,local_124);
        spv::Instruction::addIdOperand
                  ((Instruction *)
                   local_108.
                   super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   *(Id *)((long)(((local_d0->instructions).
                                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t + 8));
        IVar4 = *(Id *)((long)local_108.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8);
        local_48._M_head_impl =
             (Instruction *)
             local_108.
             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        add_instruction(this,pBVar8,
                        (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_48);
        if (local_48._M_head_impl != (Instruction *)0x0) {
          (*(local_48._M_head_impl)->_vptr_Instruction[1])();
        }
        if ((Instruction *)
            local_108.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
          (*(*(_func_int ***)
              &(local_108.
                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_0x0)[1])();
        }
      }
      spv::Builder::makeReturn(pBVar1,false,IVar4);
      (this->builder).buildPoint = local_a8;
      spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformBallot);
      spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformArithmetic);
      pFVar7 = local_b0;
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(type_id_local,opcode_local);
      local_108.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_108.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (local_b0->functionInstruction).resultId);
      std::
      vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
      ::emplace_back<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>
                (local_a0,(MultiPrefixOp *)&local_108);
      IVar4 = (pFVar7->functionInstruction).resultId;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                (&types.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
      return IVar4;
    }
    if ((pMVar6->opcode == opcode) && (pMVar6->type_id == type_id)) break;
    pMVar6 = pMVar6 + 1;
  }
  return pMVar6->func_id;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_multi_prefix_op(SPIRVModule &module, spv::Op opcode, spv::Id type_id)
{
	for (auto &call : wave_multi_prefix_call_ids)
		if (call.opcode == opcode && call.type_id == type_id)
			return call.func_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec4_type = builder.makeVectorType(bool_type, 4);

	Vector<spv::Id> types = { type_id, uvec4_type };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       opcode_to_multi_prefix_name(opcode),
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);
	spv::Id mask_id = func->getParamId(1);
	spv::Id undef_value = builder.createUndefined(type_id);

	spv::Block *outer_entry = nullptr;
	spv::Block *return_block = nullptr;
	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *prefix_block = new spv::Block(builder.getUniqueId(), *func);
	auto *continue_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_entry_block = new spv::Block(builder.getUniqueId(), *func);

		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(2), return_block, inner_entry_block);
		outer_entry = entry;
		entry = inner_entry_block;
		builder.setBuildPoint(entry);
	}

	{
		auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
		ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		ballot_op->addIdOperand(builder.makeBoolConstant(true));
		auto mask_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseAnd);
		mask_op->addIdOperand(ballot_op->getResultId());
		mask_op->addIdOperand(mask_id);
		mask_id = mask_op->getResultId();
		add_instruction(entry, std::move(ballot_op));
		add_instruction(entry, std::move(mask_op));
		builder.createBranch(header_block);
	}

	builder.setBuildPoint(header_block);
	{
		builder.createLoopMerge(merge_block, body_block, 0);
		builder.createBranch(body_block);
	}

	builder.setBuildPoint(body_block);
	spv::Id compare_reduce_id;
	{
		auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_first->addIdOperand(mask_id);

		auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec4_type, spv::OpIEqual);
		compare->addIdOperand(mask_id);
		compare->addIdOperand(broadcast_first->getResultId());

		auto compare_reduce = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
		compare_reduce->addIdOperand(compare->getResultId());
		compare_reduce_id = compare_reduce->getResultId();

		add_instruction(body_block, std::move(broadcast_first));
		add_instruction(body_block, std::move(compare));
		add_instruction(body_block, std::move(compare_reduce));
		builder.createSelectionMerge(continue_block, 0);
		builder.createConditionalBranch(compare_reduce_id, prefix_block, continue_block);
	}

	spv::Id result_id;
	builder.setBuildPoint(prefix_block);
	{
		auto prefix_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, opcode);
		prefix_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		prefix_op->addImmediateOperand(spv::GroupOperationExclusiveScan);
		prefix_op->addIdOperand(value_id);
		result_id = prefix_op->getResultId();
		add_instruction(prefix_block, std::move(prefix_op));
		builder.createBranch(continue_block);
	}

	builder.setBuildPoint(continue_block);
	{
		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(prefix_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(body_block->getId());
		result_id = phi->getResultId();
		add_instruction(continue_block, std::move(phi));
		builder.createConditionalBranch(compare_reduce_id, merge_block, header_block);
	}

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(outer_entry->getId());
		result_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, result_id);

	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	wave_multi_prefix_call_ids.push_back({ opcode, type_id, func->getId() });
	return func->getId();
}